

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int> *map,Var *max)

{
  uint uVar1;
  bool bVar2;
  Var VVar3;
  char *pcVar4;
  long lVar5;
  
  bVar2 = satisfied(this,c);
  if (bVar2) {
    return;
  }
  if (0 < *(int *)&(c->header).field_0x4) {
    lVar5 = 0;
    do {
      uVar1 = *(uint *)(&c[1].header.field_0x0 + lVar5 * 4);
      if (((byte)uVar1 & 1 ^ (this->assigns).data[(int)uVar1 >> 1].value) != 1) {
        pcVar4 = "-";
        if ((uVar1 & 1) == 0) {
          pcVar4 = "";
        }
        VVar3 = mapVar((int)uVar1 >> 1,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar4,(ulong)(VVar3 + 1));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)&(c->header).field_0x4);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, Clause &c, vec <Var> &map, Var &max) {
    if(satisfied(c)) return;

    for(int i = 0; i < c.size(); i++)
        if(value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max) + 1);
    fprintf(f, "0\n");
}